

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

void __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::buildTree
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *freq,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *alphabet,uint pos,uint this_node,
          uint *next_free_node)

{
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *this_00;
  uint uVar1;
  ulong __n;
  __uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  __p;
  byte *pbVar2;
  reference pvVar3;
  reference pvVar4;
  value_type_conflict2 *__x;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar5;
  ulong __n_00;
  uint uVar6;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  size_t capacity;
  byte bVar7;
  reference rVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_a0;
  __uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  local_98;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  capacity = 0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar6 = 0;
      (ulong)uVar6 <
      (ulong)((long)(alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start); uVar6 = uVar6 + 1) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,(ulong)uVar6);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(freq,(ulong)*pbVar2);
    capacity = capacity + *pvVar3;
  }
  bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::bitvector_t
            ((bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)&local_98,capacity,0x100);
  __p._M_t.
  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
  _M_head_impl = local_98._M_t.
                 super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                 .
                 super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                 ._M_head_impl;
  local_98._M_t.
  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
  _M_head_impl = (tuple<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                  )(_Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                    )0x0;
  std::
  __uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::reset((__uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
           *)((this->wavelet_tree).
              super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this_node),
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                   .
                   super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                   ._M_head_impl);
  std::
  unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::~unique_ptr((unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                 *)&local_98);
  __n = (ulong)pos;
  local_a0 = &this->child1;
  this_00 = &this->codes;
  uVar6 = 0;
  local_a8 = &this->child0;
  do {
    __n_00 = (ulong)uVar6;
    if ((ulong)((long)(alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= __n_00) {
      if (local_c8._M_impl.super__Vector_impl_data._M_finish !=
          local_c8._M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,freq);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
        buildTree(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,pos + 1,
                  (uint)(this->child0).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start[this_node],next_free_node);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      }
      if (local_e8._M_impl.super__Vector_impl_data._M_finish !=
          local_e8._M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,freq);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
        buildTree(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,pos + 1,
                  (uint)(this->child1).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start[this_node],next_free_node);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
      return;
    }
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
    pvVar4 = std::
             vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ::at(this_00,(ulong)*pbVar2);
    rVar8 = std::vector<bool,_std::allocator<bool>_>::at(pvVar4,__n);
    if ((*rVar8._M_p & rVar8._M_mask) == 0) {
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
      pvVar4 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at(this_00,(ulong)*pbVar2);
      if (((ulong)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1) +
          ((long)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 != __n) {
        if (local_c8._M_impl.super__Vector_impl_data._M_finish ==
            local_c8._M_impl.super__Vector_impl_data._M_start) {
          uVar1 = *next_free_node;
          (local_a8->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_start[this_node] = (unsigned_short)uVar1;
          *next_free_node = uVar1 + 1;
        }
        __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
        this_01 = &local_c8;
        goto LAB_001132c4;
      }
      bVar7 = this->sigma;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
      pvVar5 = local_a8;
LAB_0011323b:
      (pvVar5->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
      super__Vector_impl_data._M_start[this_node] = (ushort)*pbVar2 + (ushort)bVar7;
    }
    else {
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
      pvVar4 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at(this_00,(ulong)*pbVar2);
      if (((ulong)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1) +
          ((long)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 == __n) {
        bVar7 = this->sigma;
        pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
        pvVar5 = local_a0;
        goto LAB_0011323b;
      }
      if (local_e8._M_impl.super__Vector_impl_data._M_finish ==
          local_e8._M_impl.super__Vector_impl_data._M_start) {
        uVar1 = *next_free_node;
        (local_a0->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_start[this_node] = (unsigned_short)uVar1;
        *next_free_node = uVar1 + 1;
      }
      __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(alphabet,__n_00);
      this_01 = &local_e8;
LAB_001132c4:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,__x);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void buildTree(vector<ulint> freq,vector<symbol> alphabet,uint pos,uint this_node, uint * next_free_node){

		vector<symbol> alphabet0;
		vector<symbol> alphabet1;

		ulint size = 0;//size of the current bitvector

		for(uint i=0;i<alphabet.size();i++){

			size += freq.at(alphabet.at(i));

		}

		wavelet_tree[this_node] = bitvector_type(size);

		for(uint i=0;i<alphabet.size();i++){

			if(codes.at(alphabet.at(i)).at(pos)==0){//left (bit 0)

				if(codes.at(alphabet.at(i)).size()-1==pos){//leaf on left: save character

					child0[this_node] = sigma+alphabet.at(i);

				}else{

					if(alphabet0.size()==0){//if this is the first symbol seen with bit 0, allocate new tree node
						child0[this_node] = *next_free_node;
						*next_free_node += 1;
					}

					alphabet0.push_back(alphabet.at(i));

				}

			}else{//right (bit 1)

				if(codes.at(alphabet.at(i)).size()-1==pos){//leaf on right: save character

					child1[this_node] = sigma+alphabet.at(i);

				}else{

					if(alphabet1.size()==0){//if this is the first symbol seen with bit 1, allocate new tree node
						child1[this_node] = *next_free_node;
						*next_free_node += 1;
					}

					alphabet1.push_back(alphabet.at(i));

				}

			}

		}

		if(alphabet0.size()>0)
			buildTree(freq,alphabet0,pos+1,child0[this_node],next_free_node);

		if(alphabet1.size()>0)
			buildTree(freq,alphabet1,pos+1,child1[this_node],next_free_node);


	}